

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1144a71::Target::DumpLink(Value *__return_storage_ptr__,Target *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  Value *pVVar3;
  string *psVar4;
  Value local_178;
  Value local_150;
  allocator<char> local_121;
  string local_120;
  cmValue local_100;
  cmValue sysroot;
  allocator<char> local_c9;
  string local_c8;
  cmValue local_a8;
  cmValue sysrootLink;
  Value commandFragments;
  undefined1 local_40 [8];
  string lang;
  Target *this_local;
  Value *link;
  
  lang.field_2._M_local_buf[0xf] = '\0';
  Json::Value::Value(__return_storage_ptr__,objectValue);
  cmGeneratorTarget::GetLinkerLanguage((string *)local_40,this->GT,this->Config);
  Json::Value::Value((Value *)&commandFragments.limit_,(String *)local_40);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"language");
  Json::Value::operator=(pVVar3,(Value *)&commandFragments.limit_);
  Json::Value::~Value((Value *)&commandFragments.limit_);
  DumpLinkCommandFragments((Value *)&sysrootLink,this);
  bVar2 = Json::Value::empty((Value *)&sysrootLink);
  if (!bVar2) {
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"commandFragments");
    Json::Value::operator=(pVVar3,(Value *)&sysrootLink);
  }
  Json::Value::~Value((Value *)&sysrootLink);
  pcVar1 = this->GT->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMAKE_SYSROOT_LINK",&local_c9);
  local_a8 = cmMakefile::GetDefinition(pcVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  bVar2 = cmValue::operator_cast_to_bool(&local_a8);
  if (bVar2) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_a8);
    DumpSysroot((Value *)&sysroot,this,psVar4);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"sysroot");
    Json::Value::operator=(pVVar3,(Value *)&sysroot);
    Json::Value::~Value((Value *)&sysroot);
  }
  else {
    pcVar1 = this->GT->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"CMAKE_SYSROOT",&local_121);
    local_100 = cmMakefile::GetDefinition(pcVar1,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    bVar2 = cmValue::operator_cast_to_bool(&local_100);
    if (bVar2) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_100);
      DumpSysroot(&local_150,this,psVar4);
      pVVar3 = Json::Value::operator[](__return_storage_ptr__,"sysroot");
      Json::Value::operator=(pVVar3,&local_150);
      Json::Value::~Value(&local_150);
    }
  }
  bVar2 = cmGeneratorTarget::IsIPOEnabled(this->GT,(string *)local_40,this->Config);
  if (bVar2) {
    Json::Value::Value(&local_178,true);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,"lto");
    Json::Value::operator=(pVVar3,&local_178);
    Json::Value::~Value(&local_178);
  }
  lang.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((lang.field_2._M_local_buf[0xf] & 1U) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpLink()
{
  Json::Value link = Json::objectValue;
  std::string lang = this->GT->GetLinkerLanguage(this->Config);
  link["language"] = lang;
  {
    Json::Value commandFragments = this->DumpLinkCommandFragments();
    if (!commandFragments.empty()) {
      link["commandFragments"] = std::move(commandFragments);
    }
  }
  if (cmValue sysrootLink =
        this->GT->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
    link["sysroot"] = this->DumpSysroot(*sysrootLink);
  } else if (cmValue sysroot =
               this->GT->Makefile->GetDefinition("CMAKE_SYSROOT")) {
    link["sysroot"] = this->DumpSysroot(*sysroot);
  }
  if (this->GT->IsIPOEnabled(lang, this->Config)) {
    link["lto"] = true;
  }
  return link;
}